

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_step(sqlite3_stmt *pStmt)

{
  Mem *p;
  long lVar1;
  byte *pbVar2;
  int *piVar3;
  char cVar4;
  ushort uVar5;
  undefined2 uVar6;
  sqlite3 *db;
  sqlite3 *db_00;
  sqlite3 *db_01;
  Btree *p_00;
  Wal *pWVar7;
  uint *puVar8;
  long *plVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined4 uVar16;
  sqlite3_stmt *psVar17;
  ulong uVar18;
  char *pcVar19;
  undefined8 *puVar20;
  short *psVar21;
  size_t sVar22;
  ulong uVar23;
  char *pcVar24;
  undefined8 uVar25;
  byte bVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  int n;
  Mem *pMem;
  int iVar30;
  long lVar31;
  u32 uVar32;
  uint uVar33;
  long *plVar34;
  long lVar35;
  long in_FS_OFFSET;
  bool bVar36;
  int local_c4;
  StrAccum local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = vdbeSafetyNotNull((Vdbe *)pStmt);
  if (iVar10 == 0) {
    db = *(sqlite3 **)pStmt;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    local_c4 = 0;
    do {
      db_00 = *(sqlite3 **)pStmt;
      if (pStmt[199] != (sqlite3_stmt)0x2) {
        while (pStmt[199] == (sqlite3_stmt)0x3) {
          sqlite3_reset(pStmt);
        }
        if (pStmt[199] != (sqlite3_stmt)0x1) goto LAB_00121caf;
        if (((byte)pStmt[200] & 3) == 0) {
          if (db_00->nVdbeActive == 0) {
            (db_00->u1).isInterrupted = 0;
          }
          if ((((db_00->mTrace & 0x82) != 0) && ((db_00->init).busy == '\0')) &&
             (*(long *)(pStmt + 0xf8) != 0)) {
            sqlite3OsCurrentTimeInt64(db_00->pVfs,(sqlite3_int64 *)(pStmt + 0xb8));
          }
          db_00->nVdbeActive = db_00->nVdbeActive + 1;
          if (((byte)pStmt[200] & 0x40) == 0) {
            db_00->nVdbeWrite = db_00->nVdbeWrite + 1;
          }
          if (((byte)pStmt[200] & 0x80) != 0) {
            db_00->nVdbeRead = db_00->nVdbeRead + 1;
          }
          *(undefined4 *)(pStmt + 0x30) = 0;
          pStmt[199] = (sqlite3_stmt)0x2;
          goto LAB_00121caf;
        }
        *(undefined4 *)(pStmt + 0x34) = 0x11;
        uVar11 = 1;
        if ((char)pStmt[0xc6] < '\0') {
          uVar11 = sqlite3VdbeTransferError((Vdbe *)pStmt);
        }
        goto LAB_00122122;
      }
LAB_00121caf:
      if ((*(ushort *)(pStmt + 200) & 0xc) == 0) {
        db_00->nVdbeExec = db_00->nVdbeExec + 1;
        uVar11 = sqlite3VdbeExec((Vdbe *)pStmt);
        db_00->nVdbeExec = db_00->nVdbeExec + -1;
        uVar33 = uVar11;
        goto LAB_00121f61;
      }
      db_01 = *(sqlite3 **)pStmt;
      bVar26 = 1;
      if ((*(ushort *)(pStmt + 200) & 0xc) != 4) {
        bVar26 = *(byte *)((long)&db_01->flags + 3) & 1;
      }
      lVar27 = *(long *)(pStmt + 0x68);
      p = (Mem *)(lVar27 + 0x38);
      releaseMemArray(p,8);
      if (*(int *)(pStmt + 0x34) == 7) {
        sqlite3OomFault(db_01);
LAB_00121cf8:
        uVar11 = 1;
        uVar33 = 1;
        goto LAB_00121f61;
      }
      if (bVar26 == 0) {
        pMem = (Mem *)0x0;
      }
      else {
        pMem = (Mem *)(*(long *)(pStmt + 0x68) + 0x1f8);
      }
      iVar10 = *(int *)(pStmt + 0x90);
      if (pMem == (Mem *)0x0) {
        uVar28 = 0;
        plVar34 = (long *)0x0;
      }
      else {
        if ((pMem->flags & 0x10) == 0) {
          uVar28 = 0;
          plVar34 = (long *)0x0;
        }
        else {
          uVar28 = (ulong)(uint)(pMem->n >> 3);
          plVar34 = (long *)pMem->z;
        }
        if (0 < (int)uVar28) {
          uVar23 = 0;
          do {
            iVar10 = iVar10 + *(int *)(plVar34[uVar23] + 8);
            uVar23 = uVar23 + 1;
          } while (uVar28 != uVar23);
        }
      }
      iVar15 = *(int *)(pStmt + 0x30);
      iVar12 = iVar15 + 1;
      iVar29 = iVar12;
      if (iVar15 < iVar10) {
        uVar5 = *(ushort *)(pStmt + 200);
        uVar33 = 0;
        uVar11 = 0;
        iVar30 = iVar15;
        do {
          iVar13 = iVar29;
          iVar29 = iVar30 - *(int *)(pStmt + 0x90);
          psVar17 = pStmt + 0x88;
          iVar15 = iVar30;
          if (*(int *)(pStmt + 0x90) <= iVar30) {
            psVar17 = (sqlite3_stmt *)*plVar34;
            iVar14 = *(int *)(psVar17 + 8);
            iVar15 = iVar29;
            plVar9 = plVar34;
            if (iVar14 <= iVar29) {
              do {
                iVar29 = iVar29 - iVar14;
                psVar17 = (sqlite3_stmt *)plVar9[1];
                iVar14 = *(int *)(psVar17 + 8);
                iVar15 = iVar29;
                plVar9 = plVar9 + 1;
              } while (iVar14 <= iVar29);
            }
          }
          lVar35 = *(long *)psVar17;
          lVar31 = (long)iVar15;
          if ((pMem != (Mem *)0x0) && (*(char *)(lVar35 + 1 + lVar31 * 0x18) == -4)) {
            lVar1 = lVar35 + lVar31 * 0x18;
            iVar29 = (int)uVar28;
            if (iVar29 < 1) {
              uVar23 = 0;
            }
            else {
              uVar18 = 0;
              do {
                uVar23 = uVar18;
                if (plVar34[uVar18] == *(long *)(lVar1 + 0x10)) break;
                uVar18 = uVar18 + 1;
                uVar23 = uVar28;
              } while (uVar28 != uVar18);
            }
            bVar36 = true;
            if ((int)uVar23 == iVar29) {
              n = iVar29 * 8 + 8;
              iVar14 = sqlite3VdbeMemGrow(pMem,n,(uint)(iVar29 != 0));
              *(int *)(pStmt + 0x34) = iVar14;
              if (iVar14 == 0) {
                plVar34 = (long *)pMem->z;
                uVar28 = (ulong)(iVar29 + 1);
                plVar34[iVar29] = *(long *)(lVar1 + 0x10);
                uVar6 = pMem->flags;
                pMem->flags = uVar6 & 0xf240 | 0x10;
                pMem->n = n;
                iVar10 = iVar10 + *(int *)(*(long *)(lVar1 + 0x10) + 8);
                bVar36 = true;
              }
              else {
                uVar33 = 1;
                uVar11 = 1;
                bVar36 = false;
              }
            }
            iVar29 = iVar13;
            if (!bVar36) goto LAB_00121f48;
          }
          iVar29 = iVar12;
          if ((((uVar5 & 0xc) != 8) ||
              (cVar4 = *(char *)(lVar35 + lVar31 * 0x18), iVar29 = iVar13, cVar4 == -0x44)) ||
             ((0 < iVar30 && (cVar4 == '\b')))) goto LAB_00121f48;
          iVar29 = iVar13 + 1;
          iVar15 = iVar13;
          iVar30 = iVar13;
        } while (iVar13 < iVar10);
      }
      else {
        lVar35 = 0;
      }
      *(undefined4 *)(pStmt + 0x34) = 0;
      uVar33 = 0x65;
      uVar11 = 0x65;
LAB_00121f48:
      *(int *)(pStmt + 0x30) = iVar29;
      if (uVar11 != 0) goto LAB_00121f61;
      if ((db_01->u1).isInterrupted != 0) {
        *(undefined4 *)(pStmt + 0x34) = 9;
        sqlite3VdbeError((Vdbe *)pStmt,"interrupted");
        goto LAB_00121cf8;
      }
      lVar31 = (long)iVar15;
      pbVar2 = (byte *)(lVar35 + lVar31 * 0x18);
      local_58._30_2_ = 0xaaaa;
      local_58.db = (sqlite3 *)0x0;
      local_58.zText = (char *)0x0;
      local_58.nAlloc = 0;
      local_58.mxAlloc = 1000000000;
      local_58.nChar = 0;
      local_58.accError = 0;
      local_58.printfFlags = '\0';
      pcVar19 = "program";
      switch(pbVar2[1]) {
      case 0xef:
        sqlite3_str_appendf(&local_58,"subrtnsig:%d,%s",(ulong)**(uint **)(pbVar2 + 0x10),
                            *(undefined8 *)(*(uint **)(pbVar2 + 0x10) + 2));
        break;
      default:
        pcVar19 = *(char **)(pbVar2 + 0x10);
        goto switchD_00122261_caseD_fc;
      case 0xf1:
        psVar21 = *(short **)(*(long *)(pbVar2 + 0x10) + 8);
        goto LAB_001223fe;
      case 0xf2:
        puVar8 = *(uint **)(pbVar2 + 0x10);
        uVar11 = *puVar8;
        if (uVar11 != 0) {
          uVar28 = 1;
          do {
            uVar25 = 0x2c;
            if ((int)uVar28 == 1) {
              uVar25 = 0x5b;
            }
            sqlite3_str_appendf(&local_58,"%c%u",uVar25,(ulong)puVar8[uVar28]);
            uVar33 = (int)uVar28 + 1;
            uVar28 = (ulong)uVar33;
          } while (uVar33 <= uVar11);
        }
        if (local_58.nChar + 1 < local_58.nAlloc) {
          local_58.zText[local_58.nChar] = ']';
          local_58.nChar = local_58.nChar + 1;
        }
        else {
          enlargeAndAppend(&local_58,"]",1);
        }
        goto LAB_0012279d;
      case 0xf3:
        puVar20 = *(undefined8 **)(pbVar2 + 0x10);
LAB_001223df:
        uVar25 = *puVar20;
        pcVar19 = "%lld";
        goto LAB_001223f1;
      case 0xf4:
        puVar20 = *(undefined8 **)(pbVar2 + 0x10);
LAB_001222df:
        sqlite3_str_appendf(&local_58,"%.16g",(int)*puVar20);
        break;
      case 0xf5:
        uVar25 = *(undefined8 *)(*(long *)(pbVar2 + 0x10) + 0x10);
        pcVar19 = "vtab:%p";
LAB_001223f1:
        sqlite3_str_appendf(&local_58,pcVar19,uVar25);
        break;
      case 0xf6:
        puVar20 = *(undefined8 **)(pbVar2 + 0x10);
        uVar5 = *(ushort *)((long)puVar20 + 0x14);
        if ((uVar5 & 2) == 0) {
          if ((uVar5 & 0x24) != 0) goto LAB_001223df;
          if ((uVar5 & 8) != 0) goto LAB_001222df;
          pcVar19 = "NULL";
          if ((uVar5 & 1) == 0) {
            pcVar19 = "(blob)";
          }
        }
        else {
          pcVar19 = (char *)puVar20[1];
        }
        goto switchD_00122261_caseD_fc;
      case 0xf8:
        lVar35 = *(long *)(pbVar2 + 0x10);
        sqlite3_str_appendf(&local_58,"k(%d",(ulong)*(ushort *)(lVar35 + 6));
        if (*(short *)(lVar35 + 6) != 0) {
          uVar28 = 0;
          do {
            puVar20 = *(undefined8 **)(lVar35 + 0x20 + uVar28 * 8);
            pcVar19 = "";
            if (puVar20 != (undefined8 *)0x0) {
              pcVar19 = (char *)*puVar20;
            }
            strcmp(pcVar19,"BINARY");
            bVar26 = *(byte *)(*(long *)(lVar35 + 0x18) + uVar28);
            pcVar19 = "-";
            if ((bVar26 & 1) == 0) {
              pcVar19 = "";
            }
            pcVar24 = "N.";
            if ((bVar26 & 2) == 0) {
              pcVar24 = "";
            }
            sqlite3_str_appendf(&local_58,",%s%s%s",pcVar19,pcVar24);
            uVar28 = uVar28 + 1;
          } while (uVar28 < *(ushort *)(lVar35 + 6));
        }
        if (local_58.nChar + 1 < local_58.nAlloc) {
          local_58.zText[local_58.nChar] = ')';
          local_58.nChar = local_58.nChar + 1;
        }
        else {
          enlargeAndAppend(&local_58,")",1);
        }
LAB_0012279d:
        pcVar19 = (char *)0x0;
        goto switchD_00122261_caseD_fc;
      case 0xf9:
        psVar21 = *(short **)(pbVar2 + 0x10);
LAB_001223fe:
        sqlite3_str_appendf(&local_58,"%s(%d)",*(undefined8 *)(psVar21 + 0x1c),
                            (ulong)(uint)(int)*psVar21);
        break;
      case 0xfb:
        pcVar19 = (char *)**(undefined8 **)(pbVar2 + 0x10);
      case 0xfc:
        goto switchD_00122261_caseD_fc;
      case 0xfd:
        sqlite3_str_appendf(&local_58,"%d",(ulong)*(uint *)(pbVar2 + 0x10));
        break;
      case 0xfe:
        sqlite3_str_appendf(&local_58,"%.18s-%s",**(undefined8 **)(pbVar2 + 0x10),
                            sqlite3VdbeDisplayP4_encnames_rel +
                            *(int *)(sqlite3VdbeDisplayP4_encnames_rel +
                                    (ulong)*(byte *)(*(undefined8 **)(pbVar2 + 0x10) + 1) * 4));
      }
      pcVar19 = (char *)0x0;
switchD_00122261_caseD_fc:
      if (pcVar19 != (char *)0x0) {
        sVar22 = strlen(pcVar19);
        sqlite3_str_append(&local_58,pcVar19,(uint)sVar22 & 0x3fffffff);
      }
      if ((local_58.accError & 7) != 0) {
        sqlite3OomFault(db_01);
      }
      pcVar19 = sqlite3StrAccumFinish(&local_58);
      if ((*(ushort *)(pStmt + 200) & 0xc) == 8) {
        if ((*(byte *)(lVar27 + 0x4d) & 0x90) == 0) {
          *(long *)(lVar27 + 0x38) = (long)*(int *)(pbVar2 + 4);
          *(undefined2 *)(lVar27 + 0x4c) = 4;
        }
        else {
          vdbeReleaseAndSetInt64(p,(long)*(int *)(pbVar2 + 4));
        }
        if ((*(byte *)(lVar27 + 0x85) & 0x90) == 0) {
          *(long *)(lVar27 + 0x70) = (long)*(int *)(pbVar2 + 8);
          *(undefined2 *)(lVar27 + 0x84) = 4;
        }
        else {
          vdbeReleaseAndSetInt64((Mem *)(lVar27 + 0x70),(long)*(int *)(pbVar2 + 8));
        }
        if ((*(byte *)(lVar27 + 0xbd) & 0x90) == 0) {
          *(long *)(lVar27 + 0xa8) = (long)*(int *)(pbVar2 + 0xc);
          *(undefined2 *)(lVar27 + 0xbc) = 4;
        }
        else {
          vdbeReleaseAndSetInt64((Mem *)(lVar27 + 0xa8),(long)*(int *)(pbVar2 + 0xc));
        }
        lVar35 = 0xe0;
      }
      else {
        if ((*(byte *)(lVar27 + 0x4d) & 0x90) == 0) {
          *(long *)(lVar27 + 0x38) = lVar31;
          *(undefined2 *)(lVar27 + 0x4c) = 4;
        }
        else {
          vdbeReleaseAndSetInt64(p,lVar31);
        }
        sqlite3VdbeMemSetStr
                  ((Mem *)(lVar27 + 0x70),
                   sqlite3OpcodeName_azName_rel +
                   *(int *)(sqlite3OpcodeName_azName_rel + (ulong)*pbVar2 * 4),-1,'\x01',
                   (_func_void_void_ptr *)0x0);
        if ((*(byte *)(lVar27 + 0xbd) & 0x90) == 0) {
          *(long *)(lVar27 + 0xa8) = (long)*(int *)(pbVar2 + 4);
          *(undefined2 *)(lVar27 + 0xbc) = 4;
        }
        else {
          vdbeReleaseAndSetInt64((Mem *)(lVar27 + 0xa8),(long)*(int *)(pbVar2 + 4));
        }
        if ((*(byte *)(lVar27 + 0xf5) & 0x90) == 0) {
          *(long *)(lVar27 + 0xe0) = (long)*(int *)(pbVar2 + 8);
          *(undefined2 *)(lVar27 + 0xf4) = 4;
        }
        else {
          vdbeReleaseAndSetInt64((Mem *)(lVar27 + 0xe0),(long)*(int *)(pbVar2 + 8));
        }
        if ((*(byte *)(lVar27 + 0x12d) & 0x90) == 0) {
          *(long *)(lVar27 + 0x118) = (long)*(int *)(pbVar2 + 0xc);
          *(undefined2 *)(lVar27 + 300) = 4;
        }
        else {
          vdbeReleaseAndSetInt64((Mem *)(lVar27 + 0x118),(long)*(int *)(pbVar2 + 0xc));
        }
        if ((*(byte *)(lVar27 + 0x19d) & 0x90) == 0) {
          *(ulong *)(lVar27 + 0x188) = (ulong)*(ushort *)(pbVar2 + 2);
          *(undefined2 *)(lVar27 + 0x19c) = 4;
        }
        else {
          vdbeReleaseAndSetInt64((Mem *)(lVar27 + 0x188),(ulong)*(ushort *)(pbVar2 + 2));
        }
        if ((*(byte *)(lVar27 + 0x1d5) & 0x90) == 0) {
          *(undefined2 *)(lVar27 + 0x1d4) = 1;
        }
        else {
          vdbeMemClearExternAndSetNull((Mem *)(lVar27 + 0x1c0));
        }
        lVar35 = 0x150;
      }
      sqlite3VdbeMemSetStr((Mem *)(lVar27 + lVar35),pcVar19,-1,'\x01',sqlite3_free);
      *(Mem **)(pStmt + 0xa0) = p;
      bVar36 = db_01->mallocFailed == '\0';
      uVar16 = 7;
      if (bVar36) {
        uVar16 = 0;
      }
      uVar11 = 1;
      if (bVar36) {
        uVar11 = 100;
      }
      *(undefined4 *)(pStmt + 0x34) = uVar16;
      uVar33 = uVar11;
LAB_00121f61:
      if (uVar11 == 100) {
        db_00->errCode = 100;
        uVar11 = 100;
      }
      else {
        if (0 < *(long *)(pStmt + 0xb8)) {
          invokeProfileCallback(db_00,(Vdbe *)pStmt);
        }
        *(undefined8 *)(pStmt + 0xa0) = 0;
        if (uVar11 == 0x65) {
          if (db_00->autoCommit == '\0') {
            uVar11 = 0x65;
            uVar33 = 0x65;
          }
          else {
            if (db_00->nDb < 1) {
              iVar10 = 0;
            }
            else {
              lVar35 = 0;
              lVar27 = 0;
              iVar10 = 0;
              do {
                p_00 = *(Btree **)((long)&db_00->aDb->pBt + lVar35);
                if (p_00 != (Btree *)0x0) {
                  if ((p_00->sharable != '\0') &&
                     (p_00->wantToLock = p_00->wantToLock + 1, p_00->locked == '\0')) {
                    btreeLockCarefully(p_00);
                  }
                  pWVar7 = p_00->pBt->pPager->pWal;
                  if (pWVar7 == (Wal *)0x0) {
                    uVar32 = 0;
                  }
                  else {
                    uVar32 = pWVar7->iCallback;
                    pWVar7->iCallback = 0;
                  }
                  if (p_00->sharable != '\0') {
                    piVar3 = &p_00->wantToLock;
                    *piVar3 = *piVar3 + -1;
                    if (*piVar3 == 0) {
                      unlockBtreeMutex(p_00);
                    }
                  }
                  if (((0 < (int)uVar32) &&
                      (db_00->xWalCallback != (_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0))
                     && (iVar10 == 0)) {
                    iVar10 = (*db_00->xWalCallback)
                                       (db_00->pWalArg,db_00,
                                        *(char **)((long)&db_00->aDb->zDbSName + lVar35),uVar32);
                  }
                }
                lVar27 = lVar27 + 1;
                lVar35 = lVar35 + 0x20;
              } while (lVar27 < db_00->nDb);
            }
            *(int *)(pStmt + 0x34) = iVar10;
            uVar11 = 1;
            uVar33 = uVar11;
            if (iVar10 == 0) {
              uVar11 = 0x65;
              uVar33 = 0x65;
            }
          }
        }
        else if ((char)pStmt[0xc6] < '\0') {
          uVar11 = sqlite3VdbeTransferError((Vdbe *)pStmt);
          uVar33 = uVar11;
        }
        db_00->errCode = uVar11;
        if (((*(int *)(pStmt + 0x34) != 0) || ((*(sqlite3 **)pStmt)->mallocFailed != '\0')) &&
           ((iVar10 = apiHandleError(*(sqlite3 **)pStmt,*(int *)(pStmt + 0x34)), iVar10 == 7 &&
            (*(undefined4 *)(pStmt + 0x34) = 7, uVar11 = uVar33, (char)pStmt[0xc6] < '\0')))) {
          uVar11 = 7;
        }
LAB_00122122:
        uVar11 = uVar11 & db_00->errMask;
      }
      if (uVar11 != 0x11) break;
      if (local_c4 == 0x32) {
        uVar11 = 0x11;
        break;
      }
      iVar10 = *(int *)(pStmt + 0x30);
      iVar15 = sqlite3Reprepare((Vdbe *)pStmt);
      if (iVar15 == 0) {
        sqlite3_reset(pStmt);
        uVar11 = 0;
        if (-1 < iVar10) {
          pStmt[0xc5] = (sqlite3_stmt)0xfe;
        }
      }
      else {
        pcVar19 = (char *)sqlite3ValueText(db->pErr,'\x01');
        if (*(void **)(pStmt + 0xa8) != (void *)0x0) {
          sqlite3DbFreeNN(db,*(void **)(pStmt + 0xa8));
        }
        if (db->mallocFailed == '\0') {
          pcVar19 = sqlite3DbStrDup(db,pcVar19);
          *(char **)(pStmt + 0xa8) = pcVar19;
          uVar11 = apiHandleError(db,iVar15);
          *(uint *)(pStmt + 0x34) = uVar11;
        }
        else {
          *(undefined8 *)(pStmt + 0xa8) = 0;
          *(undefined4 *)(pStmt + 0x34) = 7;
          uVar11 = 7;
        }
      }
      local_c4 = local_c4 + 1;
    } while (iVar15 == 0);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  else {
    uVar11 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x165a9,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar11;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK ){
      /* This case occurs after failing to recompile an sql statement.
      ** The error message from the SQL compiler has already been loaded
      ** into the database handle. This block copies the error message
      ** from the database handle into the statement and sets the statement
      ** program counter to 0 to ensure that when the statement is
      ** finalized or reset the parser error message is available via
      ** sqlite3_errmsg() and sqlite3_errcode().
      */
      const char *zErr = (const char *)sqlite3_value_text(db->pErr);
      sqlite3DbFree(db, v->zErrMsg);
      if( !db->mallocFailed ){
        v->zErrMsg = sqlite3DbStrDup(db, zErr);
        v->rc = rc = sqlite3ApiExit(db, rc);
      } else {
        v->zErrMsg = 0;
        v->rc = rc = SQLITE_NOMEM_BKPT;
      }
      break;
    }
    sqlite3_reset(pStmt);
    if( savedPc>=0 ){
      /* Setting minWriteFileFormat to 254 is a signal to the OP_Init and
      ** OP_Trace opcodes to *not* perform SQLITE_TRACE_STMT because it has
      ** already been done once on a prior invocation that failed due to
      ** SQLITE_SCHEMA.   tag-20220401a  */
      v->minWriteFileFormat = 254;
    }
    assert( v->expired==0 );
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}